

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O3

void __thiscall
QHttpNetworkConnectionPrivate::copyCredentials
          (QHttpNetworkConnectionPrivate *this,int fromChannel,QAuthenticator *auth,bool isProxy)

{
  long lVar1;
  int iVar2;
  QObject *this_00;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QString local_68;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((fromChannel < 0) || (auth->d == (QAuthenticatorPrivate *)0x0)) ||
      ((auth->d->method & ~Basic) != Negotiate)) && (0 < this->activeChannelCount)) {
    lVar3 = 0x68;
    uVar4 = 0;
    do {
      if ((uint)fromChannel != uVar4) {
        lVar1 = lVar3;
        if (!isProxy) {
          lVar1 = lVar3 + -8;
        }
        this_00 = &this->channels->super_QObject + lVar1;
        QAuthenticator::user(&local_50,(QAuthenticator *)this_00);
        QAuthenticator::user(&local_68,auth);
        iVar2 = QString::compare((QString *)&local_50,(CaseSensitivity)&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (iVar2 != 0) {
          QAuthenticator::user(&local_50,auth);
          QAuthenticator::setUser((QAuthenticator *)this_00,&local_50);
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        QAuthenticator::password(&local_50,(QAuthenticator *)this_00);
        QAuthenticator::password(&local_68,auth);
        iVar2 = QString::compare((QString *)&local_50,(CaseSensitivity)&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (iVar2 != 0) {
          QAuthenticator::password(&local_50,auth);
          QAuthenticator::setPassword((QAuthenticator *)this_00,&local_50);
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x108;
    } while ((long)uVar4 < (long)this->activeChannelCount);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionPrivate::copyCredentials(int fromChannel, QAuthenticator *auth, bool isProxy)
{
    Q_ASSERT(auth);

    // NTLM and Negotiate do multi-phase authentication.
    // Copying credentialsbetween authenticators would mess things up.
    if (fromChannel >= 0) {
        QAuthenticatorPrivate *priv = QAuthenticatorPrivate::getPrivate(*auth);
        if (priv
            && (priv->method == QAuthenticatorPrivate::Ntlm
                || priv->method == QAuthenticatorPrivate::Negotiate)) {
            return;
        }
    }

    // select another channel
    QAuthenticator* otherAuth = nullptr;
    for (int i = 0; i < activeChannelCount; ++i) {
        if (i == fromChannel)
            continue;
        if (isProxy)
            otherAuth = &channels[i].proxyAuthenticator;
        else
            otherAuth = &channels[i].authenticator;
        // if the credentials are different, copy them
        if (otherAuth->user().compare(auth->user()))
            otherAuth->setUser(auth->user());
        if (otherAuth->password().compare(auth->password()))
            otherAuth->setPassword(auth->password());
    }
}